

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

void __thiscall cmCPackIFWGenerator::~cmCPackIFWGenerator(cmCPackIFWGenerator *this)

{
  (this->super_cmCPackGenerator)._vptr_cmCPackGenerator = (_func_int **)&PTR_GetNameOfClass_005db3a0
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->RepoDirsVector);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->PkgsDirsVector);
  std::__cxx11::string::~string((string *)&this->OutputExtension);
  std::__cxx11::string::~string((string *)&this->ExecutableSuffix);
  std::__cxx11::string::~string((string *)&this->FrameworkVersion);
  std::__cxx11::string::~string((string *)&this->BinCreator);
  std::__cxx11::string::~string((string *)&this->RepoGen);
  std::
  _Rb_tree<cmCPackComponentGroup_*,_std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>,_std::_Select1st<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>,_std::less<cmCPackComponentGroup_*>,_std::allocator<std::pair<cmCPackComponentGroup_*const,_cmCPackIFWPackage_*>_>_>
  ::~_Rb_tree(&(this->GroupPackages)._M_t);
  std::
  _Rb_tree<cmCPackComponent_*,_std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>,_std::_Select1st<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
  ::~_Rb_tree(&(this->ComponentPackages)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage::DependenceStruct>_>_>
  ::~_Rb_tree(&(this->DependentPackages)._M_t);
  std::
  _Rb_tree<cmCPackIFWPackage_*,_cmCPackIFWPackage_*,_std::_Identity<cmCPackIFWPackage_*>,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
  ::~_Rb_tree(&(this->DownloadedPackages)._M_t);
  std::
  _Rb_tree<cmCPackIFWPackage_*,_cmCPackIFWPackage_*,_std::_Identity<cmCPackIFWPackage_*>,_std::less<cmCPackIFWPackage_*>,_std::allocator<cmCPackIFWPackage_*>_>
  ::~_Rb_tree(&(this->BinaryPackages)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWRepository>_>_>
  ::~_Rb_tree(&(this->Repositories)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
  ::~_Rb_tree(&(this->Packages)._M_t);
  cmCPackIFWRepository::~cmCPackIFWRepository(&this->Repository);
  cmCPackIFWInstaller::~cmCPackIFWInstaller(&this->Installer);
  cmCPackGenerator::~cmCPackGenerator(&this->super_cmCPackGenerator);
  return;
}

Assistant:

cmCPackIFWGenerator::~cmCPackIFWGenerator() = default;